

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array_stack.cpp
# Opt level: O0

void __thiscall
ArrayStack_PushAndPopMaxValues_Test::~ArrayStack_PushAndPopMaxValues_Test
          (ArrayStack_PushAndPopMaxValues_Test *this)

{
  ArrayStack_PushAndPopMaxValues_Test *this_local;
  
  ~ArrayStack_PushAndPopMaxValues_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ArrayStack, PushAndPopMaxValues) {
    pstore::array_stack<int, 2> stack;
    stack.push (31);
    stack.push (33);
    stack.pop ();
    stack.pop ();
    EXPECT_EQ (0U, stack.size ());
    EXPECT_TRUE (stack.empty ());
}